

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rbuVfsRead(sqlite3_file *pFile,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  sqlite3_io_methods *psVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  int iVar6;
  u8 *aBuf;
  
  psVar1 = pFile[3].pMethods;
  if (psVar1 != (sqlite3_io_methods *)0x0) {
    if (psVar1->iVersion == 1) {
      if ((((ulong)pFile[5].pMethods & 0x80000) != 0) && ((long)psVar1[1].xShmBarrier <= iOfst)) {
        iVar3 = 0;
        memset(zBuf,0,(long)iAmt);
        goto LAB_001e7c91;
      }
    }
    else if (psVar1->iVersion == 3) {
      if (*(int *)((long)&psVar1[1].xFetch + 4) != 0xb) {
        *(undefined4 *)&psVar1->xLock = 5;
        return 2;
      }
      *(int *)&psVar1[2].xClose = iAmt;
      iVar3 = *(int *)((long)&psVar1[1].xUnfetch + 4);
      if (*(int *)&psVar1[1].xUnfetch == iVar3) {
        iVar6 = 0x80;
        if (iVar3 != 0) {
          iVar6 = iVar3 * 2;
        }
        pvVar5 = *(void **)(psVar1 + 2);
        iVar3 = sqlite3_initialize();
        if (iVar3 == 0) {
          pvVar5 = sqlite3Realloc(pvVar5,(long)iVar6 << 3);
        }
        else {
          pvVar5 = (void *)0x0;
        }
        if (pvVar5 == (void *)0x0) {
          return 7;
        }
        *(void **)(psVar1 + 2) = pvVar5;
        *(int *)((long)&psVar1[1].xUnfetch + 4) = iVar6;
      }
      uVar4 = (int)((iOfst + -0x20) / (long)(iAmt + 0x18)) + 1;
      if (*(uint *)&psVar1[1].xFetch < uVar4) {
        *(uint *)&psVar1[1].xFetch = uVar4;
      }
      lVar2 = *(long *)(psVar1 + 2);
      iVar3 = *(int *)&psVar1[1].xUnfetch;
      *(uint *)(lVar2 + 4 + (long)iVar3 * 8) = uVar4;
      *(undefined4 *)(lVar2 + (long)iVar3 * 8) = 0;
      *(int *)&psVar1[1].xUnfetch = iVar3 + 1;
      return 0;
    }
  }
  iVar3 = (**(code **)(*(long *)pFile[1].pMethods + 0x10))(pFile[1].pMethods,zBuf,iAmt,iOfst);
  if (((psVar1 != (sqlite3_io_methods *)0x0) &&
      ((((iOfst == 0 &&
         (psVar1->xWrite == (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0)) &&
        (iVar3 == 0x20a)) &&
       ((iVar3 = 0x20a, ((ulong)pFile[5].pMethods & 0x100) != 0 && (*(int *)&psVar1->xLock == 0)))))
      ) && (iVar3 = (**(code **)(*(long *)psVar1[2].xLock + 0x10))(psVar1[2].xLock,zBuf,iAmt,0),
           iVar3 == 0)) {
    uVar4 = *(uint *)((long)zBuf + 0x34);
    *(undefined2 *)((long)zBuf + 0x34) = 0;
    *(undefined1 *)((long)zBuf + 0x36) = 0;
    *(bool *)((long)zBuf + 0x37) =
         ((uVar4 >> 0x18 != 0 || (uVar4 & 0xff0000) != 0) || (uVar4 & 0xff00) != 0) ||
         (uVar4 & 0xff) != 0;
    *(undefined4 *)((long)zBuf + 0x1c) = 0x1000000;
    *(undefined8 *)((long)zBuf + 0x20) = 0;
    uVar4 = *(int *)(psVar1[2].xLock + 0x2c) + 1;
    *(uint *)((long)zBuf + 0x18) =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000;
    if (100 < iAmt) {
      memset((void *)((long)zBuf + 100),0,(ulong)(iAmt - 100));
      *(ushort *)((long)zBuf + 0x69) = (ushort)iAmt << 8 | (ushort)iAmt >> 8;
      *(undefined1 *)((long)zBuf + 100) = 0xd;
    }
  }
LAB_001e7c91:
  if (((iOfst == 0) && (iVar3 == 0)) && (iVar3 = 0, ((ulong)pFile[5].pMethods & 0x100) != 0)) {
    uVar4 = *(uint *)((long)zBuf + 0x18);
    *(uint *)((long)&pFile[5].pMethods + 4) =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    *(undefined1 *)&pFile[6].pMethods = *(undefined1 *)((long)zBuf + 0x13);
  }
  return iVar3;
}

Assistant:

static int rbuVfsRead(
  sqlite3_file *pFile, 
  void *zBuf, 
  int iAmt, 
  sqlite_int64 iOfst
){
  rbu_file *p = (rbu_file*)pFile;
  sqlite3rbu *pRbu = p->pRbu;
  int rc;

  if( pRbu && pRbu->eStage==RBU_STAGE_CAPTURE ){
    assert( p->openFlags & SQLITE_OPEN_WAL );
    rc = rbuCaptureWalRead(p->pRbu, iOfst, iAmt);
  }else{
    if( pRbu && pRbu->eStage==RBU_STAGE_OAL 
     && (p->openFlags & SQLITE_OPEN_WAL) 
     && iOfst>=pRbu->iOalSz 
    ){
      rc = SQLITE_OK;
      memset(zBuf, 0, iAmt);
    }else{
      rc = p->pReal->pMethods->xRead(p->pReal, zBuf, iAmt, iOfst);
#if 1
      /* If this is being called to read the first page of the target 
      ** database as part of an rbu vacuum operation, synthesize the 
      ** contents of the first page if it does not yet exist. Otherwise,
      ** SQLite will not check for a *-wal file.  */
      if( pRbu && rbuIsVacuum(pRbu) 
          && rc==SQLITE_IOERR_SHORT_READ && iOfst==0
          && (p->openFlags & SQLITE_OPEN_MAIN_DB)
          && pRbu->rc==SQLITE_OK
      ){
        sqlite3_file *pFd = (sqlite3_file*)pRbu->pRbuFd;
        rc = pFd->pMethods->xRead(pFd, zBuf, iAmt, iOfst);
        if( rc==SQLITE_OK ){
          u8 *aBuf = (u8*)zBuf;
          u32 iRoot = rbuGetU32(&aBuf[52]) ? 1 : 0;
          rbuPutU32(&aBuf[52], iRoot);      /* largest root page number */
          rbuPutU32(&aBuf[36], 0);          /* number of free pages */
          rbuPutU32(&aBuf[32], 0);          /* first page on free list trunk */
          rbuPutU32(&aBuf[28], 1);          /* size of db file in pages */
          rbuPutU32(&aBuf[24], pRbu->pRbuFd->iCookie+1);  /* Change counter */

          if( iAmt>100 ){
            memset(&aBuf[100], 0, iAmt-100);
            rbuPutU16(&aBuf[105], iAmt & 0xFFFF);
            aBuf[100] = 0x0D;
          }
        }
      }
#endif
    }
    if( rc==SQLITE_OK && iOfst==0 && (p->openFlags & SQLITE_OPEN_MAIN_DB) ){
      /* These look like magic numbers. But they are stable, as they are part
       ** of the definition of the SQLite file format, which may not change. */
      u8 *pBuf = (u8*)zBuf;
      p->iCookie = rbuGetU32(&pBuf[24]);
      p->iWriteVer = pBuf[19];
    }
  }
  return rc;
}